

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_int8_x86(InnerProduct_x86_avx *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  ulong uVar4;
  Layer *pLVar5;
  int _w;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  int j;
  size_t sVar9;
  int _elempack;
  size_t _elemsize;
  byte bVar10;
  ParamDict pd;
  Mat local_78;
  
  p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
  switch(*(undefined4 *)(p_Var2 + 0x38 + (long)&(this->weight_data_int8).data)) {
  case 1:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  case 2:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var2 + 0x40 + (long)&(this->weight_data_int8).data));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  case 3:
    pLVar5 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var2 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(p_Var2 + 0x40 + (long)&(this->weight_data_int8).data) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  case 4:
    pLVar5 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  case 5:
    pLVar5 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_78);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  case 6:
    pLVar5 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_78);
    ParamDict::set((ParamDict *)&local_78,0,
                   **(float **)(p_Var2 + 0x40 + (long)&(this->weight_data_int8).data));
    ParamDict::set((ParamDict *)&local_78,1,
                   *(float *)(*(long *)(p_Var2 + 0x40 + (long)&(this->weight_data_int8).data) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_78);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_001e89a8;
  }
  ParamDict::~ParamDict((ParamDict *)&local_78);
LAB_001e89a8:
  if (pLVar5 != (Layer *)0x0) {
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  }
  this->activation = pLVar5;
  p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
  uVar1 = *(uint *)(p_Var2 + 0x28 + (long)&(this->weight_data_int8).data);
  uVar4 = (long)*(int *)(p_Var2 + 0x30 + (long)&(this->weight_data_int8).data) / (long)(int)uVar1;
  bVar10 = (uVar1 & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar10 != 0) {
    _elemsize = 8;
  }
  p_Var2 = this->_vptr_InnerProduct_x86_avx[-3];
  _w = (int)uVar4;
  Mat::reshape(&local_78,(Mat *)(p_Var2 + 0x40 + (long)&(this->scales_in).data),_w,
               *(int *)(p_Var2 + 0x28 + (long)&(this->weight_data_int8).data),(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_int8,_w,
              *(int *)(this->_vptr_InnerProduct_x86_avx[-3] + 0x28 +
                      (long)&(this->weight_data_int8).data) / _elempack,_elemsize,_elempack,
              (Allocator *)0x0);
  pp_Var3 = this->_vptr_InnerProduct_x86_avx;
  if (_elempack <= *(int *)(pp_Var3[-3] + 0x28 + (long)&(this->weight_data_int8).data)) {
    lVar6 = 0;
    do {
      if (0 < _w) {
        pvVar7 = (void *)((ulong)((uint)lVar6 >> bVar10 * '\x03') * (long)(this->weight_data_int8).w
                          * (this->weight_data_int8).elemsize + (long)(this->weight_data_int8).data)
        ;
        uVar8 = 0;
        do {
          sVar9 = 0;
          do {
            *(undefined1 *)((long)pvVar7 + sVar9) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar8 + (long)local_78.w * (lVar6 + sVar9) * local_78.elemsize);
            sVar9 = sVar9 + 1;
          } while (_elemsize != sVar9);
          uVar8 = uVar8 + 1;
          pvVar7 = (void *)((long)pvVar7 + sVar9);
        } while (uVar8 != (uVar4 & 0xffffffff));
      }
      lVar6 = lVar6 + _elemsize;
    } while ((long)(lVar6 + (ulong)(_elempack - 1)) <
             (long)*(int *)(pp_Var3[-3] + 0x28 + (long)&(this->weight_data_int8).data));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_int8.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_int8.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    return 0;
}